

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O2

_Bool adjust_order_ops_depth_block(borg_calculation *f,int pdepth,int start,int end)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  void **ppvVar6;
  borg_array *pbVar7;
  void **ppvVar8;
  undefined1 extraout_AL;
  borg_array *a;
  uint *item;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int l [4];
  
  a = (borg_array *)mem_zalloc(0x10);
  l[0] = 0;
  l[1] = 0;
  l[2] = 0;
  l[3] = 0;
  for (lVar15 = (long)start; lVar15 < end; lVar15 = lVar15 + 1) {
    puVar5 = (uint *)f->token_array->items[lVar15];
    if ((puVar5[4] == pdepth) && (2 < *puVar5)) {
      item = (uint *)mem_alloc(0xc);
      uVar2 = *puVar5;
      *item = uVar2;
      uVar10 = 0;
      if ((1 < uVar2 - 5) && (uVar10 = 1, 1 < uVar2 - 3)) {
        uVar10 = (uVar2 - 7 < 2) + 2;
      }
      item[1] = uVar10;
      item[2] = (uint)lVar15;
      l[uVar10] = l[uVar10] + 1;
      borg_array_add(a,item);
    }
  }
  iVar3 = a->count;
  uVar9 = (ulong)iVar3;
  if (1 < (long)uVar9) {
    lVar15 = 1;
    iVar12 = 0;
    for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
      if (l[uVar11] != 0) {
        ppvVar6 = a->items;
        for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
          lVar14 = lVar15;
          if (uVar11 == *(uint *)((long)ppvVar6[uVar13] + 4)) {
            do {
              if (lVar14 == 4) {
                if (iVar3 + -1 <= iVar12) goto LAB_00211e61;
                break;
              }
              piVar1 = l + lVar14;
              lVar14 = lVar14 + 1;
            } while (*piVar1 == 0);
            uVar2 = *(uint *)((long)ppvVar6[uVar13] + 8);
            pbVar7 = f->token_array;
            ppvVar8 = pbVar7->items;
            lVar14 = (long)(int)uVar2;
            uVar10 = *(uint *)((long)ppvVar8[lVar14] + 0x10);
            *(uint *)((long)ppvVar8[lVar14] + 0x10) = uVar10 + 1;
            for (uVar16 = (ulong)uVar2; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
              puVar5 = (uint *)ppvVar8[uVar16 - 1];
              uVar2 = puVar5[4];
              if (((int)uVar2 < (int)uVar10) || ((2 < *puVar5 && (uVar2 == uVar10)))) break;
              puVar5[4] = uVar2 + 1;
              if (f->max_depth <= (int)uVar2) {
                f->max_depth = uVar2 + 1;
              }
            }
            iVar4 = pbVar7->count;
            while (lVar14 = lVar14 + 1, lVar14 < iVar4) {
              puVar5 = (uint *)ppvVar8[lVar14];
              uVar2 = puVar5[4];
              if (((int)uVar2 < (int)uVar10) || ((2 < *puVar5 && (uVar2 == uVar10)))) break;
              puVar5[4] = uVar2 + 1;
              if (f->max_depth <= (int)uVar2) {
                f->max_depth = uVar2 + 1;
              }
            }
            iVar12 = iVar12 + 1;
          }
LAB_00211e61:
        }
      }
      lVar15 = lVar15 + 1;
    }
  }
  for (lVar15 = 0; lVar15 < (int)uVar9; lVar15 = lVar15 + 1) {
    mem_free(a->items[lVar15]);
    a->items[lVar15] = (void *)0x0;
    uVar9 = (ulong)(uint)a->count;
  }
  mem_free(a);
  return (_Bool)extraout_AL;
}

Assistant:

static bool adjust_order_ops_depth_block(
    struct borg_calculation *f, int pdepth, int start, int end)
{
    struct operator_struct {
        enum token_type type;
        int             level;
        int             position;
    };
    struct borg_array      *operators = mem_zalloc(sizeof(struct borg_array));
    struct operator_struct *o;
    int                     tok;
    int                     i, j;
    int                     lvl;
    int                     l[4] = { 0, 0, 0, 0 };

    for (tok = start; tok < end; tok++) {
        struct token *token = f->token_array->items[tok];
        if (token->pdepth != pdepth)
            continue;
        if (is_operator(token->type)) {
            o           = mem_alloc(sizeof(struct operator_struct));
            o->type     = token->type;
            o->level    = operation_level(token->type);
            o->position = tok;
            l[o->level]++;
            borg_array_add(operators, o);
        }
    }

    /* find groups at the same level so the formula */
    /* 1 + 2 * (3 + 4 * 5) + 6 + 7 */
    /* already has things at two levels */
    /* "1 + 2 *" is at one level "3 + 4 * 5" is deeper (done first) and */
    /* "+ 6 + 7" is back at the first level.  */
    /* it grabs the groups and the adds depth (as if they were parenthesized) */
    /* to higher operations levels.  so it grabs 1 + 2 * (deeper) and */
    /* calculates "*" is first so it makes it as if it was 1 + (2 * (deeper)) */
    /* by pushing the 2 and the "(deeper)" down.  Repeat until all levels are */
    /* handled */
    bool higher;
    if (operators->count > 1) {
        int count_at_level = 0;
        for (lvl = 0; lvl < OP_LEVELS; lvl++) {
            if (l[lvl]) {
                for (i = 0; i < operators->count; i++) {
                    o = operators->items[i];
                    if (o->level == lvl) {
                        /* if there is an at higher level or this isn't the last
                         */
                        /* the last check is for a*b*c needs to be (a*b)*c */
                        higher = false;
                        for (j = lvl + 1; j < OP_LEVELS; j++)
                            if (l[j]) {
                                higher = true;
                                break;
                            }
                        if (higher || count_at_level < (operators->count - 1)) {
                            add_depth(f, o->position);
                            count_at_level++;
                        }
                    }
                }
            }
        }
    }

    /* free up the temporary memory */
    for (i = 0; i < operators->count; i++) {
        mem_free(operators->items[i]);
        operators->items[i] = NULL;
    }
    mem_free(operators);
    operators = NULL;

    return false;
}